

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O1

void * Kf_WorkerThread(void *pArg)

{
  int fArea;
  long *plVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Kf_ThData_t *pThData;
  timespec ts;
  timespec local_40;
  
  plVar1 = (long *)**pArg;
  fArea = *(int *)(plVar1[1] + 0x38);
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0xc) == 0);
    if (*(int *)((long)pArg + 0xc) != 1) {
      __assert_fail("pThData->Status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                    ,0x3cd,"void *Kf_WorkerThread(void *)");
    }
    if (*(int *)((long)pArg + 8) == -1) {
      pthread_exit((void *)0x0);
    }
    if (*(int *)((long)pArg + 8) < 0) break;
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar6 = 1;
    }
    else {
      lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
      lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_40.tv_sec * -1000000;
    }
    iVar3 = *(int *)((long)pArg + 8);
    if (((long)iVar3 < 0) || (*(int *)(*plVar1 + 0x18) <= iVar3)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar2 = *(undefined8 *)(*(long *)(*plVar1 + 0x20) + (long)iVar3 * 0xc);
    uVar5 = iVar3 - ((uint)uVar2 & 0x1fffffff);
    if (((((int)uVar5 < 0) || (*(int *)((long)plVar1 + 0x34) <= (int)uVar5)) ||
        (uVar4 = iVar3 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff), (int)uVar4 < 0)) ||
       (*(int *)((long)plVar1 + 0x34) <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    lVar7 = plVar1[5];
    uVar5 = *(uint *)(plVar1[7] + (ulong)uVar5 * 4);
    uVar4 = *(uint *)(plVar1[7] + (ulong)uVar4 * 4);
    Kf_SetMergeOrder(*pArg,(int *)((long)(int)(uVar5 & *(uint *)((long)plVar1 + 0x14)) * 8 +
                                  *(long *)(lVar7 + (long)((int)uVar5 >>
                                                          (*(byte *)(plVar1 + 2) & 0x1f)) * 8)),
                     (int *)((long)(int)(uVar4 & *(uint *)((long)plVar1 + 0x14)) * 8 +
                            *(long *)(lVar7 + (long)((int)uVar4 >> (*(byte *)(plVar1 + 2) & 0x1f)) *
                                              8)),fArea,(int)lVar7);
    iVar3 = clock_gettime(3,&local_40);
    if (iVar3 < 0) {
      lVar7 = -1;
    }
    else {
      lVar7 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    *(long *)((long)pArg + 0x10) = *(long *)((long)pArg + 0x10) + lVar7 + lVar6;
    *(undefined4 *)((long)pArg + 0xc) = 0;
  }
  __assert_fail("pThData->Id >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaKf.c"
                ,0x3d4,"void *Kf_WorkerThread(void *)");
}

Assistant:

void * Kf_WorkerThread( void * pArg )
{
    Kf_ThData_t * pThData = (Kf_ThData_t *)pArg;
    Kf_Man_t * pMan = pThData->pSett->pMan;
    int fAreaOnly = pThData->pSett->pMan->pPars->fAreaOnly;
    int fCutMin = pThData->pSett->pMan->pPars->fCutMin;
    volatile int * pPlace = &pThData->Status;
    abctime clk;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->Status == 1 );
        if ( pThData->Id == -1 )
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }
        assert( pThData->Id >= 0 );
        clk = Abc_Clock();
        Kf_SetMergeOrder( pThData->pSett, Kf_ObjCuts0(pMan, pThData->Id), Kf_ObjCuts1(pMan, pThData->Id), fAreaOnly, fCutMin );
        pThData->clkUsed += Abc_Clock() - clk;
        pThData->Status = 0;
//        printf( "Finished object %d\n", pThData->Id );
    }
    assert( 0 );
    return NULL;
}